

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_custom.cpp
# Opt level: O2

bool ImGui::ButtonColored(char *label,ImVec4 *color,ImVec2 *size)

{
  float t;
  bool bVar1;
  ImVec4 colorPress;
  ImVec4 local_48;
  ImVec4 colorHover;
  
  t = color->w;
  colorPress.z = 1.0;
  colorPress.x = 1.0;
  colorPress.y = 1.0;
  colorPress.w = t;
  colorHover = ImLerp(&colorPress,color,1.0);
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_48.w = t;
  colorPress = ImLerp(&local_48,color,t);
  PushStyleColor(0x15,color);
  PushStyleColor(0x16,&colorHover);
  PushStyleColor(0x17,&colorPress);
  bVar1 = Button(label,size);
  PopStyleColor(3);
  return bVar1;
}

Assistant:

bool ButtonColored(const char *label, const ImVec4 &color, const ImVec2 &size) {
    ImVec4 colorHover = ImLerp({1, 1, 1, color.w}, color, 0.8f);
    ImVec4 colorPress = ImLerp({0, 0, 0, color.w}, color, 0.8f);
    ImGui::PushStyleColor(ImGuiCol_Button, color);
    ImGui::PushStyleColor(ImGuiCol_ButtonHovered, colorHover);
    ImGui::PushStyleColor(ImGuiCol_ButtonActive, colorPress);
    bool ret = ImGui::Button(label, size);
    ImGui::PopStyleColor(3);
    return ret;
}